

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_0::DummyService::request
          (DummyService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  ArrayDisposer *pAVar1;
  undefined8 uVar2;
  long *plVar3;
  WebSocket *pWVar4;
  Promise<void> *pPVar5;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  char (*params) [25];
  undefined1 *puVar10;
  PromiseNode *pPVar11;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *extraout_RDX_04;
  HttpHeaderTable *pHVar12;
  PromiseNode *extraout_RDX_05;
  PromiseNode *extraout_RDX_06;
  PromiseNode *extraout_RDX_07;
  PromiseNode *extraout_RDX_08;
  PromiseNode *extraout_RDX_09;
  PromiseNode *extraout_RDX_10;
  PromiseNode *extraout_RDX_11;
  undefined4 in_register_00000034;
  Array<kj::Promise<void>_> *pAVar13;
  Promise<void> PVar14;
  Own<kj::_::TransformPromiseNode<kj::_::Void,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj____kj_async_h:195:68),_kj::_::PropagateException>_>
  OVar15;
  Own<kj::_::TransformPromiseNode<kj::_::Void,_kj::Array<unsigned_char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj____kj_async_h:195:68),_kj::_::PropagateException>_>
  OVar16;
  Promise<void> sendPromise;
  Own<kj::WebSocket> ws;
  Array<kj::Promise<void>_> result;
  String body;
  ArrayBuilder<kj::Promise<void>_> promises;
  PropagateException local_229;
  undefined1 local_228 [24];
  long *local_210;
  Own<kj::WebSocket> local_208;
  Array<kj::Promise<void>_> local_1f8;
  String local_1d8;
  char (*local_1b8) [25];
  HttpHeaders *local_1b0;
  String local_1a8;
  Exception local_188;
  undefined1 local_30 [8];
  undefined1 *local_28;
  
  params = (char (*) [25])url.content.size_;
  local_1b8 = params;
  local_1b0 = headers;
  bVar8 = HttpHeaders::isWebSocket((HttpHeaders *)requestBody);
  if (bVar8) {
    HttpHeaders::HttpHeaders
              ((HttpHeaders *)&local_188,
               *(HttpHeaderTable **)(CONCAT44(in_register_00000034,method) + 8));
    (*(sendPromise.super_PromiseBase.node.disposer)->_vptr_Disposer[1])
              (local_228 + 0x10,sendPromise.super_PromiseBase.node.disposer,&local_188);
    HttpHeaders::~HttpHeaders((HttpHeaders *)&local_188);
    pAVar1 = (ArrayDisposer *)requestBody[1]._vptr_AsyncInputStream[0x17];
    if (pAVar1 < (ArrayDisposer *)0x2) {
      local_188.ownFile.content.ptr = (char *)((ulong)local_188.ownFile.content.ptr._1_7_ << 8);
    }
    else {
      local_188.ownFile.content.size_ = (size_t)requestBody[1]._vptr_AsyncInputStream[0x16];
      local_188.ownFile.content.ptr = (char *)CONCAT71(local_188.ownFile.content.ptr._1_7_,1);
      local_188.ownFile.content.disposer = pAVar1;
    }
    local_1f8.ptr = (Promise<void> *)0x3a5b0a;
    local_1f8.size_ = 5;
    pAVar13 = &local_1f8;
    if ((char)local_188.ownFile.content.ptr != '\0') {
      pAVar13 = (Array<kj::Promise<void>_> *)&local_188.ownFile.content.size_;
    }
    str<kj::StringPtr,char_const(&)[2],kj::StringPtr&>
              (&local_1d8,(kj *)pAVar13,(StringPtr *)0x3c8cf5,(char (*) [2])&local_1b8,
               (StringPtr *)headers);
    pHVar12 = (HttpHeaderTable *)local_1d8.content.size_;
    if ((HttpHeaderTable *)local_1d8.content.size_ != (HttpHeaderTable *)0x0) {
      pHVar12 = (HttpHeaderTable *)local_1d8.content.ptr;
    }
    (**(code **)(*local_210 + 8))(local_228,local_210,pHVar12);
    local_188.ownFile.content.ptr =
         (char *)_::HeapArrayDisposer::allocateImpl
                           (0x10,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_188.ownFile.content.disposer =
         (ArrayDisposer *)((long)local_188.ownFile.content.ptr + 0x20);
    local_188.file = (char *)&_::HeapArrayDisposer::instance;
    local_188.ownFile.content.size_ = (size_t)local_188.ownFile.content.ptr;
    PVar14 = Promise<void>::attach<kj::String>((Promise<void> *)&local_1f8,(String *)local_228);
    (((PromiseBase *)local_188.ownFile.content.size_)->node).disposer = (Disposer *)local_1f8.ptr;
    (((PromiseBase *)local_188.ownFile.content.size_)->node).ptr = (PromiseNode *)local_1f8.size_;
    local_188.ownFile.content.size_ = local_188.ownFile.content.size_ + 0x10;
    (**(code **)(*local_210 + 0x30))(&local_208,local_210,PVar14.super_PromiseBase.node.ptr);
    OVar15 = heap<kj::_::TransformPromiseNode<kj::_::Void,kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::ignoreResult()::_lambda(kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::ignoreResult()::_lambda(kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>&&)_1_,kj::_::PropagateException>
                       ((Own<kj::_::PromiseNode> *)&local_1f8,
                        (anon_class_1_0_00000001_for_func *)&local_208,&local_229);
    pWVar4 = local_208.ptr;
    *(undefined4 *)&(((PromiseBase *)local_188.ownFile.content.size_)->node).disposer =
         local_1f8.ptr._0_4_;
    *(undefined4 *)((long)&(((PromiseBase *)local_188.ownFile.content.size_)->node).disposer + 4) =
         local_1f8.ptr._4_4_;
    *(undefined4 *)&(((PromiseBase *)local_188.ownFile.content.size_)->node).ptr =
         (undefined4)local_1f8.size_;
    *(undefined4 *)((long)&(((PromiseBase *)local_188.ownFile.content.size_)->node).ptr + 4) =
         local_1f8.size_._4_4_;
    local_188.ownFile.content.size_ = local_188.ownFile.content.size_ + 0x10;
    if (local_208.ptr != (WebSocket *)0x0) {
      local_208.ptr = (WebSocket *)0x0;
      (**(local_208.disposer)->_vptr_Disposer)
                (local_208.disposer,
                 (_func_int *)((long)&pWVar4->_vptr_WebSocket + (long)pWVar4->_vptr_WebSocket[-2]),
                 OVar15.ptr);
    }
    local_1f8.size_ =
         (long)(local_188.ownFile.content.size_ - (long)local_188.ownFile.content.ptr) >> 4;
    local_1f8.ptr = (Promise<void> *)local_188.ownFile.content.ptr;
    local_1f8.disposer = (ArrayDisposer *)local_188.file;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_188.ownFile.content.disposer = (ArrayDisposer *)0x0;
    joinPromises((kj *)&local_208,&local_1f8);
    PVar14 = Promise<void>::attach<kj::Own<kj::WebSocket>>((Promise<void> *)this,&local_208);
    pWVar4 = local_208.ptr;
    pPVar11 = PVar14.super_PromiseBase.node.ptr;
    if (local_208.ptr != (WebSocket *)0x0) {
      local_208.ptr = (WebSocket *)0x0;
      (**(local_208.disposer)->_vptr_Disposer)
                (local_208.disposer,
                 (_func_int *)((long)&pWVar4->_vptr_WebSocket + (long)pWVar4->_vptr_WebSocket[-2]));
      pPVar11 = extraout_RDX;
    }
    sVar6 = local_1f8.size_;
    pPVar5 = local_1f8.ptr;
    if (local_1f8.ptr != (Promise<void> *)0x0) {
      local_1f8.ptr = (Promise<void> *)0x0;
      local_1f8.size_ = 0;
      (**(local_1f8.disposer)->_vptr_ArrayDisposer)
                (local_1f8.disposer,pPVar5,0x10,sVar6,sVar6,
                 ArrayDisposer::Dispose_<kj::Promise<void>,_false>::destruct);
      pPVar11 = extraout_RDX_00;
    }
    pAVar1 = local_188.ownFile.content.disposer;
    sVar6 = local_188.ownFile.content.size_;
    pcVar7 = local_188.ownFile.content.ptr;
    if (local_188.ownFile.content.ptr != (char *)0x0) {
      local_188.ownFile.content.ptr = (char *)0x0;
      local_188.ownFile.content.size_ = 0;
      local_188.ownFile.content.disposer = (ArrayDisposer *)0x0;
      (***(_func_int ***)local_188.file)
                (local_188.file,pcVar7,0x10,(long)(sVar6 - (long)pcVar7) >> 4,
                 (long)pAVar1 - (long)pcVar7 >> 4,
                 ArrayDisposer::Dispose_<kj::Promise<void>,_false>::destruct);
      pPVar11 = extraout_RDX_01;
    }
    uVar2 = local_228._8_8_;
    if ((AsyncOutputStream *)local_228._8_8_ != (AsyncOutputStream *)0x0) {
      local_228._8_8_ = (AsyncOutputStream *)0x0;
      (**(code **)*(_func_int **)local_228._0_8_)
                (local_228._0_8_,
                 (_func_int *)((long)(_func_int ***)uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
      pPVar11 = extraout_RDX_02;
    }
    sVar6 = local_1d8.content.size_;
    pcVar7 = local_1d8.content.ptr;
    if ((HttpHeaderTable *)local_1d8.content.ptr != (HttpHeaderTable *)0x0) {
      local_1d8.content.ptr = (char *)0x0;
      local_1d8.content.size_ = 0;
      (**(local_1d8.content.disposer)->_vptr_ArrayDisposer)
                (local_1d8.content.disposer,pcVar7,1,sVar6,sVar6,0);
      pPVar11 = extraout_RDX_03;
    }
    plVar3 = local_210;
    if (local_210 != (long *)0x0) {
      local_210 = (long *)0x0;
      (***(_func_int ***)local_228._16_8_)
                (local_228._16_8_,(long)plVar3 + *(long *)(*plVar3 + -0x10));
      pPVar11 = extraout_RDX_04;
    }
  }
  else if ((local_1b0 == (HttpHeaders *)0x7) && (iVar9 = bcmp(local_1b8,"/throw",6), iVar9 == 0)) {
    _::Debug::makeDescription<char_const(&)[25]>
              (&local_1a8,(Debug *)"\"client requested failure\"","client requested failure",params)
    ;
    Exception::Exception
              (&local_188,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0xb37,&local_1a8);
    heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_1d8,&local_188);
    sVar6 = local_1d8.content.size_;
    local_1d8.content.size_ = 0;
    (this->super_HttpService)._vptr_HttpService = (_func_int **)local_1d8.content.ptr;
    this->headerTable = (HttpHeaderTable *)sVar6;
    Exception::~Exception(&local_188);
    sVar6 = local_1a8.content.size_;
    pcVar7 = local_1a8.content.ptr;
    pPVar11 = extraout_RDX_10;
    if (local_1a8.content.ptr != (char *)0x0) {
      local_1a8.content.ptr = (char *)0x0;
      local_1a8.content.size_ = 0;
      (**(local_1a8.content.disposer)->_vptr_ArrayDisposer)
                (local_1a8.content.disposer,pcVar7,1,sVar6,sVar6,0);
      pPVar11 = extraout_RDX_11;
    }
  }
  else {
    pAVar1 = (ArrayDisposer *)requestBody[1]._vptr_AsyncInputStream[0x17];
    if (pAVar1 < (ArrayDisposer *)0x2) {
      local_188.ownFile.content.ptr = (char *)((ulong)local_188.ownFile.content.ptr._1_7_ << 8);
    }
    else {
      local_188.ownFile.content.size_ = (size_t)requestBody[1]._vptr_AsyncInputStream[0x16];
      local_188.ownFile.content.ptr = (char *)CONCAT71(local_188.ownFile.content.ptr._1_7_,1);
      local_188.ownFile.content.disposer = pAVar1;
    }
    local_1f8.ptr = (Promise<void> *)0x3a5b0a;
    local_1f8.size_ = 5;
    pAVar13 = &local_1f8;
    if ((char)local_188.ownFile.content.ptr != '\0') {
      pAVar13 = (Array<kj::Promise<void>_> *)&local_188.ownFile.content.size_;
    }
    str<kj::StringPtr,char_const(&)[2],kj::StringPtr&>
              (&local_1d8,(kj *)pAVar13,(StringPtr *)0x3c8cf5,(char (*) [2])&local_1b8,
               (StringPtr *)headers);
    HttpHeaders::HttpHeaders
              ((HttpHeaders *)&local_188,
               *(HttpHeaderTable **)(CONCAT44(in_register_00000034,method) + 8));
    local_28 = (undefined1 *)0x0;
    if ((HttpHeaderTable *)local_1d8.content.size_ != (HttpHeaderTable *)0x0) {
      local_28 = (undefined1 *)
                 ((long)&(((HttpHeaderTable *)(local_1d8.content.size_ + -0x30))->idsByName).ptr + 7
                 );
    }
    local_30[0] = 1;
    (**(sendPromise.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_228 + 0x10,sendPromise.super_PromiseBase.node.disposer,200,"OK",3,&local_188,
               local_30);
    HttpHeaders::~HttpHeaders((HttpHeaders *)&local_188);
    local_188.ownFile.content.ptr =
         (char *)_::HeapArrayDisposer::allocateImpl
                           (0x10,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_188.ownFile.content.disposer =
         (ArrayDisposer *)((long)local_188.ownFile.content.ptr + 0x20);
    local_188.file = (char *)&_::HeapArrayDisposer::instance;
    pHVar12 = (HttpHeaderTable *)local_1d8.content.size_;
    if ((HttpHeaderTable *)local_1d8.content.size_ != (HttpHeaderTable *)0x0) {
      pHVar12 = (HttpHeaderTable *)local_1d8.content.ptr;
    }
    puVar10 = (undefined1 *)0x0;
    if ((HttpHeaderTable *)local_1d8.content.size_ != (HttpHeaderTable *)0x0) {
      puVar10 = (undefined1 *)
                ((long)&(((HttpHeaderTable *)(local_1d8.content.size_ + -0x30))->idsByName).ptr + 7)
      ;
    }
    local_188.ownFile.content.size_ = (size_t)local_188.ownFile.content.ptr;
    (**(code **)*local_210)(&local_1f8,local_210,pHVar12,puVar10);
    (((PromiseBase *)local_188.ownFile.content.size_)->node).disposer = (Disposer *)local_1f8.ptr;
    (((PromiseBase *)local_188.ownFile.content.size_)->node).ptr = (PromiseNode *)local_1f8.size_;
    local_188.ownFile.content.size_ = local_188.ownFile.content.size_ + 0x10;
    AsyncInputStream::readAllBytes((AsyncInputStream *)local_228,(uint64_t)response);
    OVar16 = heap<kj::_::TransformPromiseNode<kj::_::Void,kj::Array<unsigned_char>,kj::Promise<kj::Array<unsigned_char>>::ignoreResult()::_lambda(kj::Array<unsigned_char>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::Promise<kj::Array<unsigned_char>>::ignoreResult()::_lambda(kj::Array<unsigned_char>&&)_1_,kj::_::PropagateException>
                       ((Own<kj::_::PromiseNode> *)&local_1f8,
                        (anon_class_1_0_00000001_for_func *)local_228,
                        (PropagateException *)&local_208);
    uVar2 = local_228._8_8_;
    *(undefined4 *)&(((PromiseBase *)local_188.ownFile.content.size_)->node).disposer =
         local_1f8.ptr._0_4_;
    *(undefined4 *)((long)&(((PromiseBase *)local_188.ownFile.content.size_)->node).disposer + 4) =
         local_1f8.ptr._4_4_;
    *(undefined4 *)&(((PromiseBase *)local_188.ownFile.content.size_)->node).ptr =
         (undefined4)local_1f8.size_;
    *(undefined4 *)((long)&(((PromiseBase *)local_188.ownFile.content.size_)->node).ptr + 4) =
         local_1f8.size_._4_4_;
    local_188.ownFile.content.size_ = local_188.ownFile.content.size_ + 0x10;
    if ((AsyncOutputStream *)local_228._8_8_ != (AsyncOutputStream *)0x0) {
      local_228._8_8_ = (AsyncOutputStream *)0x0;
      (**(code **)*(_func_int **)local_228._0_8_)
                (local_228._0_8_,
                 (_func_int *)((long)(_func_int ***)uVar2 + (long)(*(_func_int ***)uVar2)[-2]),
                 OVar16.ptr);
    }
    local_1f8.size_ =
         (long)(local_188.ownFile.content.size_ - (long)local_188.ownFile.content.ptr) >> 4;
    local_1f8.ptr = (Promise<void> *)local_188.ownFile.content.ptr;
    local_1f8.disposer = (ArrayDisposer *)local_188.file;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_188.ownFile.content.disposer = (ArrayDisposer *)0x0;
    joinPromises((kj *)local_228,&local_1f8);
    PVar14 = Promise<void>::attach<kj::Own<kj::AsyncOutputStream>,kj::String>
                       ((Promise<void> *)this,(Own<kj::AsyncOutputStream> *)local_228,
                        (String *)(local_228 + 0x10));
    uVar2 = local_228._8_8_;
    pPVar11 = PVar14.super_PromiseBase.node.ptr;
    if ((AsyncOutputStream *)local_228._8_8_ != (AsyncOutputStream *)0x0) {
      local_228._8_8_ = (AsyncOutputStream *)0x0;
      (**(code **)*(_func_int **)local_228._0_8_)
                (local_228._0_8_,
                 (_func_int *)((long)(_func_int ***)uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
      pPVar11 = extraout_RDX_05;
    }
    sVar6 = local_1f8.size_;
    pPVar5 = local_1f8.ptr;
    if (local_1f8.ptr != (Promise<void> *)0x0) {
      local_1f8.ptr = (Promise<void> *)0x0;
      local_1f8.size_ = 0;
      (**(local_1f8.disposer)->_vptr_ArrayDisposer)
                (local_1f8.disposer,pPVar5,0x10,sVar6,sVar6,
                 ArrayDisposer::Dispose_<kj::Promise<void>,_false>::destruct);
      pPVar11 = extraout_RDX_06;
    }
    pAVar1 = local_188.ownFile.content.disposer;
    sVar6 = local_188.ownFile.content.size_;
    pcVar7 = local_188.ownFile.content.ptr;
    if (local_188.ownFile.content.ptr != (char *)0x0) {
      local_188.ownFile.content.ptr = (char *)0x0;
      local_188.ownFile.content.size_ = 0;
      local_188.ownFile.content.disposer = (ArrayDisposer *)0x0;
      (***(_func_int ***)local_188.file)
                (local_188.file,pcVar7,0x10,(long)(sVar6 - (long)pcVar7) >> 4,
                 (long)pAVar1 - (long)pcVar7 >> 4,
                 ArrayDisposer::Dispose_<kj::Promise<void>,_false>::destruct);
      pPVar11 = extraout_RDX_07;
    }
    plVar3 = local_210;
    if (local_210 != (long *)0x0) {
      local_210 = (long *)0x0;
      (***(_func_int ***)local_228._16_8_)
                (local_228._16_8_,(long)plVar3 + *(long *)(*plVar3 + -0x10));
      pPVar11 = extraout_RDX_08;
    }
    sVar6 = local_1d8.content.size_;
    pcVar7 = local_1d8.content.ptr;
    if ((HttpHeaderTable *)local_1d8.content.ptr != (HttpHeaderTable *)0x0) {
      local_1d8.content.ptr = (char *)0x0;
      local_1d8.content.size_ = 0;
      (**(local_1d8.content.disposer)->_vptr_ArrayDisposer)
                (local_1d8.content.disposer,pcVar7,1,sVar6,sVar6,0);
      pPVar11 = extraout_RDX_09;
    }
  }
  PVar14.super_PromiseBase.node.ptr = pPVar11;
  PVar14.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar14.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    if (!headers.isWebSocket()) {
      if (url == "/throw") {
        return KJ_EXCEPTION(FAILED, "client requested failure");
      }

      auto body = kj::str(headers.get(HttpHeaderId::HOST).orDefault("null"), ":", url);
      auto stream = response.send(200, "OK", HttpHeaders(headerTable), body.size());
      auto promises = kj::heapArrayBuilder<kj::Promise<void>>(2);
      promises.add(stream->write(body.begin(), body.size()));
      promises.add(requestBody.readAllBytes().ignoreResult());
      return kj::joinPromises(promises.finish()).attach(kj::mv(stream), kj::mv(body));
    } else {
      auto ws = response.acceptWebSocket(HttpHeaders(headerTable));
      auto body = kj::str(headers.get(HttpHeaderId::HOST).orDefault("null"), ":", url);
      auto sendPromise = ws->send(body);

      auto promises = kj::heapArrayBuilder<kj::Promise<void>>(2);
      promises.add(sendPromise.attach(kj::mv(body)));
      promises.add(ws->receive().ignoreResult());
      return kj::joinPromises(promises.finish()).attach(kj::mv(ws));
    }
  }